

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenEnum
          (KotlinKMPGenerator *this,EnumDef *enum_def,CodeWriter *writer)

{
  string field_type;
  string enum_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_148;
  undefined1 local_128 [32];
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((enum_def->super_Definition).generated == false) {
    GenerateComment(this,&(enum_def->super_Definition).doc_comment,writer,
                    (CommentConfig *)(anonymous_namespace)::comment_config);
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_48,&this->namer_,enum_def);
    GenTypeBasic_abi_cxx11_(&local_68,this,&(enum_def->underlying_type).base_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"@Suppress(\"unused\")",(allocator<char> *)&bStack_148);
    CodeWriter::operator+=(writer,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"@JvmInline",(allocator<char> *)&bStack_148);
    CodeWriter::operator+=(writer,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::operator+(&local_e8,"value class ",&local_48);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   &local_e8," (val value: ");
    std::operator+(&bStack_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   &local_68);
    std::operator+(&local_c8,&bStack_148,") {");
    CodeWriter::operator+=(writer,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&bStack_148);
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)&local_e8);
    writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + 1;
    local_128._0_8_ = enum_def;
    local_128._8_8_ = writer;
    local_128._16_8_ = this;
    local_128._24_8_ = &local_48;
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinKMPGenerator::GenEnum(flatbuffers::EnumDef&,flatbuffers::CodeWriter&)const::_lambda()_1_,void>
              ((function<void()> *)&bStack_148,(anon_class_32_4_16f44947 *)local_128);
    GenerateCompanionObject(this,writer,(function<void_()> *)&bStack_148);
    std::_Function_base::~_Function_base((_Function_base *)&bStack_148);
    if (writer->cur_ident_lvl_ != 0) {
      writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + -1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"}",(allocator<char> *)&bStack_148);
    CodeWriter::operator+=(writer,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void GenEnum(EnumDef &enum_def, CodeWriter &writer) const {
    if (enum_def.generated) return;

    GenerateComment(enum_def.doc_comment, writer, &comment_config);
    auto enum_type = namer_.Type(enum_def);
    auto field_type = GenTypeBasic(enum_def.underlying_type.base_type);
    writer += "@Suppress(\"unused\")";
    writer += "@JvmInline";
    writer += "value class " + enum_type + " (val value: " + field_type + ") {";
    writer.IncrementIdentLevel();

    GenerateCompanionObject(writer, [&]() {
      // Write all properties
      auto vals = enum_def.Vals();

      for (auto it = vals.begin(); it != vals.end(); ++it) {
        auto &ev = **it;
        auto val = enum_def.ToString(ev);
        auto suffix = LiteralSuffix(enum_def.underlying_type);
        writer.SetValue("name", namer_.Variant(ev));
        writer.SetValue("type", enum_type);
        writer.SetValue("val", val + suffix);
        GenerateComment(ev.doc_comment, writer, &comment_config);
        writer += "val {{name}} = {{type}}({{val}})";
      }

      // Generate a generate string table for enum values.
      // Problem is, if values are very sparse that could generate really
      // big tables. Ideally in that case we generate a map lookup
      // instead, but for the moment we simply don't output a table at all.
      auto range = enum_def.Distance();
      // Average distance between values above which we consider a table
      // "too sparse". Change at will.
      static const uint64_t kMaxSparseness = 5;
      if (range / static_cast<uint64_t>(enum_def.size()) < kMaxSparseness) {
        GeneratePropertyOneLine(writer, "names", "Array<String>", [&]() {
          writer += "arrayOf(\\";
          auto val = enum_def.Vals().front();
          for (auto it = vals.begin(); it != vals.end(); ++it) {
            auto ev = *it;
            for (auto k = enum_def.Distance(val, ev); k > 1; --k)
              writer += "\"\", \\";
            val = ev;
            writer += "\"" + (*it)->name + "\"\\";
            if (it + 1 != vals.end()) { writer += ", \\"; }
          }
          writer += ")";
        });
        std::string e_param = "e: " + enum_type;
        GenerateFunOneLine(
            writer, "name", e_param, "String",
            [&]() {
              writer += "names[e.value.toInt()\\";
              if (enum_def.MinValue()->IsNonZero())
                writer += " - " + namer_.Variant(*enum_def.MinValue()) +
                          ".value.toInt()\\";
              writer += "]";
            },
            parser_.opts.gen_jvmstatic);
      }
    });
    writer.DecrementIdentLevel();
    writer += "}";
  }